

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O3

string * __thiscall
cs222::Pass2::calculateDisp_abi_cxx11_
          (string *__return_storage_ptr__,Pass2 *this,int address,Instruction *instruction,
          char *flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  string *this_00;
  byte bVar3;
  size_t sVar4;
  long *plVar5;
  int iVar6;
  size_type *psVar7;
  uint dec;
  Pass2 *pPVar8;
  long lVar9;
  string binaryString;
  undefined1 local_b8 [32];
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  pPVar8 = this;
  sVar4 = Instruction::getAddress(instruction);
  iVar6 = address - (int)sVar4;
  if (iVar6 - 0x803U < 0xfffff000) {
    flags[3] = '1';
    flags[4] = '0';
    dec = address - this->base;
    if (0x1000 < dec) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->errorReportMessage,0,
                 (char *)(this->errorReportMessage)._M_string_length,0x13620d);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
  }
  else {
    dec = iVar6 - 3;
  }
  decimalToHex_abi_cxx11_(__return_storage_ptr__,pPVar8,dec);
  uVar2 = __return_storage_ptr__->_M_string_length;
  local_78 = __return_storage_ptr__;
  if (uVar2 < 4) {
    if (uVar2 != 3) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x03' - (char)uVar2);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_b8,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b8);
    if ((Pass2 *)local_b8._0_8_ != (Pass2 *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "DISPLACEMENT: ",__return_storage_ptr__);
  logDebug((string *)local_b8);
  if ((Pass2 *)local_b8._0_8_ != (Pass2 *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  Instruction::getOperation_abi_cxx11_(&local_98,instruction);
  bVar3 = getOpcode(&local_98);
  local_50._M_dataplus._M_p = (pointer)(ulong)(bVar3 >> 2);
  std::bitset<6ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (bitset<6ul> *)&local_50);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  lVar9 = 0;
  do {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
    std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_98._M_string_length,0,'\x01');
    std::__cxx11::string::operator=((string *)local_b8,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  pPVar8 = (Pass2 *)local_b8._0_8_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
  this_00 = local_78;
  binaryToHex(&local_50,pPVar8,&local_70);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(this_00->_M_dataplus)._M_p);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_98.field_2._M_allocated_capacity = *psVar7;
    local_98.field_2._8_8_ = plVar5[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar7;
    local_98._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_98._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((Pass2 *)local_b8._0_8_ != (Pass2 *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  return this_00;
}

Assistant:

std::string Pass2::calculateDisp(int address,Instruction &instruction, char flags[6])
    {
        int disp = address - (instruction.getAddress()+3);
        if (disp > 2047 || disp < -2048)
        {
            //use base relative
            if (base != INT_MIN)
            {
                flags[3] = '1';
                flags[4] = '0';
                disp = address - base;
                if (disp < 0 || disp > 4096)
                {
                    errorReportMessage = "Disp is out of range";
                    return "";
                }

            }else
            {
                errorReportMessage = "Base register is empty!!";
                return "";
            }
        }
        std::string objCode = decimalToHex(disp);
        if (objCode.length() > 3) objCode = objCode.substr(objCode.length() - 3,3);
        else if (objCode.length() < 3) objCode.insert(0,3-objCode.size(),'0');
        logDebug("DISPLACEMENT: " + objCode);

        std::string binaryString = charToBinStr(getOpcode(instruction.getOperation()));
        for (int i = 0; i < 6; ++i) {
            binaryString = binaryString + flags[i];
        }
        objCode = binaryToHex(binaryString) + objCode;
        return objCode;
    }